

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::GetKeyFromPool
          (LegacyScriptPubKeyMan *this,CPubKey *result,OutputType type)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  int in_EDX;
  void *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  WalletBatch batch;
  int64_t nIndex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  CKeyPool keypool;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  WalletDatabase *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined1 in_stack_fffffffffffffeeb;
  int in_stack_fffffffffffffeec;
  char *pszFile;
  uint in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff08;
  int iVar6;
  undefined4 in_stack_ffffffffffffff0c;
  byte local_d1;
  undefined8 local_c0;
  undefined1 local_b4 [11];
  undefined1 in_stack_ffffffffffffff57;
  CHDChain *in_stack_ffffffffffffff58;
  WalletBatch *in_stack_ffffffffffffff60;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff68;
  char local_58 [8];
  undefined1 auStack_50 [7];
  undefined1 in_stack_ffffffffffffffb7;
  CKeyPool *in_stack_ffffffffffffffb8;
  int64_t *in_stack_ffffffffffffffc0;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 3) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x592,
                  "bool wallet::LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey &, const OutputType)")
    ;
  }
  uVar5 = (**(code **)((in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__align
                      + 0x68))(in_RDI,0);
  if ((uVar5 & 1) == 0) {
    local_d1 = 0;
  }
  else {
    pszFile = local_58;
    CKeyPool::CKeyPool((CKeyPool *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),in_RDI,
               (char *)((ulong)in_stack_fffffffffffffefc << 0x20),pszFile,in_stack_fffffffffffffeec,
               (bool)in_stack_fffffffffffffeeb);
    bVar3 = ReserveKeyFromKeyPool
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,(bool)in_stack_ffffffffffffffb7);
    if ((bVar3) ||
       (plVar2 = *(long **)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base.
                                   _M_mutex + 8),
       bVar4 = (**(code **)(*plVar2 + 0x20))(plVar2,0x100000000), (bVar4 & 1) != 0)) {
      (**(code **)((in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex.__align +
                  0x38))(in_RDI,local_c0,local_b4);
      memcpy(in_RSI,auStack_50,0x41);
      iVar6 = 0;
    }
    else {
      bVar4 = (**(code **)(**(long **)((long)&(in_RDI->super_recursive_mutex).
                                              super___recursive_mutex_base._M_mutex + 8) + 0x50))();
      if ((bVar4 & 1) == 0) {
        (**(code **)(**(long **)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base
                                        ._M_mutex + 8) + 0x18))();
        WalletBatch::WalletBatch
                  ((WalletBatch *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
        GenerateNewKey(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                       ,(bool)in_stack_ffffffffffffff57);
        memcpy(in_RSI,&stack0xffffffffffffff67,0x41);
        local_d1 = 1;
        iVar6 = 1;
        WalletBatch::~WalletBatch
                  ((WalletBatch *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      }
      else {
        local_d1 = 0;
        iVar6 = 1;
      }
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (iVar6 == 0) {
      local_d1 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_d1 & 1);
}

Assistant:

bool LegacyScriptPubKeyMan::GetKeyFromPool(CPubKey& result, const OutputType type)
{
    assert(type != OutputType::BECH32M);
    if (!CanGetAddresses(/*internal=*/ false)) {
        return false;
    }

    CKeyPool keypool;
    {
        LOCK(cs_KeyStore);
        int64_t nIndex;
        if (!ReserveKeyFromKeyPool(nIndex, keypool, /*fRequestedInternal=*/ false) && !m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
            if (m_storage.IsLocked()) return false;
            WalletBatch batch(m_storage.GetDatabase());
            result = GenerateNewKey(batch, m_hd_chain, /*internal=*/ false);
            return true;
        }
        KeepDestination(nIndex, type);
        result = keypool.vchPubKey;
    }
    return true;
}